

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::AtomTypesSectionParser::parseLine
          (AtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  bool bVar1;
  int iVar2;
  AtomType *pAVar3;
  AtomType *this_00;
  ostream *poVar4;
  RealType m;
  string atomTypeName;
  string baseAtomTypeName;
  StringTokenizer tokenizer;
  string sStack_b8;
  string local_98;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_b8," ;\t\n\r",(allocator<char> *)&local_98);
  StringTokenizer::StringTokenizer(&local_78,line,&sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  iVar2 = StringTokenizer::countTokens(&local_78);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,"AtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&sStack_b8,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
    pAVar3 = ForceField::getAtomType(ff,&local_98);
    if (pAVar3 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "AtomTypesSectionParser Error: Could not find matching base atom type to %s at line %d\n"
               ,local_98._M_dataplus._M_p,(ulong)(uint)lineNo);
      painCave.isFatal = 1;
      simError();
    }
    this_00 = ForceField::getAtomType(ff,&sStack_b8);
    if (this_00 == (AtomType *)0x0) {
      this_00 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(this_00);
      (*this_00->_vptr_AtomType[2])(this_00,pAVar3);
      AtomType::setIdent(this_00,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
      AtomType::setName(this_00,&sStack_b8);
      ForceField::addAtomType(ff,&sStack_b8,this_00);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"duplicate atom type: ");
      poVar4 = std::operator<<(poVar4,(string *)&sStack_b8);
      poVar4 = std::operator<<(poVar4," on line ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lineNo);
      std::operator<<(poVar4,"\n");
    }
    bVar1 = StringTokenizer::hasMoreTokens(&local_78);
    if (bVar1) {
      m = StringTokenizer::nextTokenAsDouble(&local_78);
      AtomType::setMass(this_00,m);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&sStack_b8);
  }
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void AtomTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in AtomTypeSection, a line at least contains 2 tokens
    // atomTypeName and mass
    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "AtomTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string atomTypeName     = tokenizer.nextToken();
      std::string baseAtomTypeName = tokenizer.nextToken();

      AtomType* baseAtomType =
          dynamic_cast<AtomType*>(ff.getAtomType(baseAtomTypeName));

      if (baseAtomType == NULL) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "AtomTypesSectionParser Error: Could not find matching base atom "
            "type to "
            "%s at line %d\n",
            baseAtomTypeName.c_str(), lineNo);
        painCave.isFatal = 1;
        simError();
      }

      AtomType* atomType = ff.getAtomType(atomTypeName);

      if (atomType == NULL) {
        atomType = new AtomType();
        atomType->useBase(baseAtomType);
        int ident = ff.getNAtomType();
        atomType->setIdent(ident);
        atomType->setName(atomTypeName);
        ff.addAtomType(atomTypeName, atomType);
      } else {
        std::cerr << "duplicate atom type: " << atomTypeName << " on line "
                  << lineNo << "\n";
      }

      if (tokenizer.hasMoreTokens()) {
        RealType mass = tokenizer.nextTokenAsDouble();
        atomType->setMass(mass);
      }
    }
  }